

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegExecCtxtPtr xmlRegNewExecCtxt(xmlRegexpPtr comp,xmlRegExecCallbacks callback,void *data)

{
  xmlRegExecCtxtPtr __s;
  int *piVar1;
  
  if ((comp != (xmlRegexpPtr)0x0) &&
     (((comp->compact != (int *)0x0 || (comp->states != (xmlRegStatePtr *)0x0)) &&
      (__s = (xmlRegExecCtxtPtr)(*xmlMalloc)(0x98), __s != (xmlRegExecCtxtPtr)0x0)))) {
    memset(__s,0,0x98);
    __s->status = 0;
    __s->determinist = 1;
    __s->maxRollbacks = 0;
    __s->nbRollbacks = 0;
    __s->rollbacks = (xmlRegExecRollback *)0x0;
    __s->comp = comp;
    if (comp->compact == (int *)0x0) {
      __s->state = *comp->states;
    }
    __s->transno = 0;
    __s->transcount = 0;
    __s->callback = callback;
    __s->data = data;
    if ((long)comp->nbCounters < 1) {
      __s->counts = (int *)0x0;
      piVar1 = (int *)0x0;
    }
    else {
      piVar1 = (int *)(*xmlMalloc)((long)comp->nbCounters << 3);
      __s->counts = piVar1;
      if (piVar1 == (int *)0x0) {
        (*xmlFree)(__s);
        return (xmlRegExecCtxtPtr)0x0;
      }
      memset(piVar1,0,(long)comp->nbCounters << 3);
      piVar1 = __s->counts + comp->nbCounters;
    }
    __s->errCounts = piVar1;
    __s->inputStackMax = 0;
    __s->inputStackNr = 0;
    __s->inputStack = (xmlRegInputTokenPtr)0x0;
    __s->errStateNo = -1;
    __s->errString = (xmlChar *)0x0;
    __s->nbPush = 0;
    return __s;
  }
  return (xmlRegExecCtxtPtr)0x0;
}

Assistant:

xmlRegExecCtxtPtr
xmlRegNewExecCtxt(xmlRegexpPtr comp, xmlRegExecCallbacks callback, void *data) {
    xmlRegExecCtxtPtr exec;

    if (comp == NULL)
	return(NULL);
    if ((comp->compact == NULL) && (comp->states == NULL))
        return(NULL);
    exec = (xmlRegExecCtxtPtr) xmlMalloc(sizeof(xmlRegExecCtxt));
    if (exec == NULL)
	return(NULL);
    memset(exec, 0, sizeof(xmlRegExecCtxt));
    exec->inputString = NULL;
    exec->index = 0;
    exec->determinist = 1;
    exec->maxRollbacks = 0;
    exec->nbRollbacks = 0;
    exec->rollbacks = NULL;
    exec->status = XML_REGEXP_OK;
    exec->comp = comp;
    if (comp->compact == NULL)
	exec->state = comp->states[0];
    exec->transno = 0;
    exec->transcount = 0;
    exec->callback = callback;
    exec->data = data;
    if (comp->nbCounters > 0) {
        /*
	 * For error handling, exec->counts is allocated twice the size
	 * the second half is used to store the data in case of rollback
	 */
	exec->counts = (int *) xmlMalloc(comp->nbCounters * sizeof(int)
	                                 * 2);
	if (exec->counts == NULL) {
	    xmlFree(exec);
	    return(NULL);
	}
        memset(exec->counts, 0, comp->nbCounters * sizeof(int) * 2);
	exec->errCounts = &exec->counts[comp->nbCounters];
    } else {
	exec->counts = NULL;
	exec->errCounts = NULL;
    }
    exec->inputStackMax = 0;
    exec->inputStackNr = 0;
    exec->inputStack = NULL;
    exec->errStateNo = -1;
    exec->errString = NULL;
    exec->nbPush = 0;
    return(exec);
}